

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O2

string * __thiscall
duckdb::StringUtil::Format<unsigned_char,std::__cxx11::string>
          (string *__return_storage_ptr__,StringUtil *this,string *fmt_str,uchar params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1)

{
  undefined7 in_register_00000009;
  string local_40 [32];
  
  ::std::__cxx11::string::string(local_40,(string *)CONCAT71(in_register_00000009,params));
  Exception::ConstructMessage<unsigned_char,std::__cxx11::string>
            (__return_storage_ptr__,(Exception *)this,(string *)((ulong)fmt_str & 0xffffffff),
             (uchar)local_40,params_1);
  ::std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}